

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TrackerBase * __thiscall Catch::TestCaseTracking::TrackerBase::name_abi_cxx11_(TrackerBase *this)

{
  long in_RSI;
  TrackerBase *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x10));
  return this;
}

Assistant:

virtual std::string name() const CATCH_OVERRIDE {
            return m_name;
        }